

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double birthday_cdf(int n)

{
  int iVar1;
  double dVar2;
  
  if (n < 1) {
    return 0.0;
  }
  if (0x16d < (uint)n) {
    return 1.0;
  }
  dVar2 = 1.0;
  for (iVar1 = 0x16d; n + iVar1 != 0x16d; iVar1 = iVar1 + -1) {
    dVar2 = (dVar2 * (double)iVar1) / 365.0;
  }
  return 1.0 - dVar2;
}

Assistant:

double birthday_cdf ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    BIRTHDAY_CDF returns the Birthday Concurrence CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of people whose birthdays have been
//    disclosed.
//
//    Output, double BIRTHDAY_CDF, the probability that at least
//    two of the N people have matching birthays..
//
{
  double cdf;
  int i;

  if ( n < 1 )
  {
    cdf = 0.0;
    return cdf;
  }
  else if ( 365 < n )
  {
    cdf = 1.0;
    return cdf;
  }
//
//  Compute the probability that N people have distinct birthdays.
//
  cdf = 1.0;
  for ( i = 1; i <= n; i++ )
  {
    cdf = cdf * static_cast<double>(365 + 1 - i ) / 365.0;
  }
//
//  Compute the probability that it is NOT the case that N people
//  have distinct birthdays.  This is the cumulative probability
//  that person 2 matches person 1, or person 3 matches 1 or 2,
//  etc.
//
  cdf = 1.0 - cdf;

  return cdf;
}